

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O2

array<unsigned_long,_6UL> * __thiscall
Omega_h::Overlay::get_cell_faces
          (array<unsigned_long,_6UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  long lVar1;
  long lVar2;
  LOs cells2faces;
  Adj local_40;
  
  Omega_h::Mesh::get_adj(&local_40,&this->mesh,3,2);
  Write<int>::Write(&cells2faces.write_,&local_40.super_Graph.ab2b.write_);
  Adj::~Adj(&local_40);
  lVar2 = cell * 0x600000000;
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->_M_elems[lVar1] =
         (long)*(int *)((long)cells2faces.write_.shared_alloc_.direct_ptr + (lVar2 >> 0x1e));
    lVar2 = lVar2 + 0x100000000;
  }
  Write<int>::~Write(&cells2faces.write_);
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 6> Overlay::get_cell_faces(size_t cell) const {
  std::array<size_t, 6> faces;
  auto cells2faces = mesh.get_adj(REGION, FACE).ab2b;
  for (size_t i = 0; i < 6; ++i) {
    faces[i] = size_t(cells2faces[LO(cell * 6 + i)]);
  }
  return faces;
}